

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfa.h
# Opt level: O0

vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *
spvtools::CFA<spvtools::val::BasicBlock>::TraversalRoots
          (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
           *__return_storage_ptr__,
          vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *blocks,
          get_blocks_func *succ_func,get_blocks_func *pred_func)

{
  bool bVar1;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *this;
  reference ppBVar2;
  size_type sVar3;
  BasicBlock *local_d8;
  BasicBlock *block_1;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range2_1;
  BasicBlock *block;
  const_iterator __end0;
  const_iterator __begin0;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *__range2;
  undefined1 local_90 [8];
  anon_class_32_4_fc377077 traverse_from_root;
  anon_class_1_0_00000001 no_terminal_blocks;
  anon_class_8_1_9f2c660a *paStack_68;
  anon_class_1_0_00000001 ignore_block;
  anon_class_8_1_9f2c660a mark_visited;
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  visited;
  get_blocks_func *pred_func_local;
  get_blocks_func *succ_func_local;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *blocks_local;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *result;
  
  std::
  unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  ::unordered_set((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                   *)&mark_visited);
  paStack_68 = &mark_visited;
  local_90 = (undefined1  [8])&stack0xffffffffffffff98;
  traverse_from_root.succ_func =
       (get_blocks_func *)((long)&traverse_from_root.no_terminal_blocks + 7);
  traverse_from_root.ignore_block =
       (anon_class_1_0_00000001 *)((long)&traverse_from_root.no_terminal_blocks + 6);
  traverse_from_root.mark_visited = (anon_class_8_1_9f2c660a *)succ_func;
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            (__return_storage_ptr__);
  __end0 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
           begin(blocks);
  block = (BasicBlock *)
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          end(blocks);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                *)&block);
    if (!bVar1) {
      __end0_1 = std::
                 vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                 begin(blocks);
      block_1 = (BasicBlock *)
                std::
                vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
                end(blocks);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end0_1,
                                (__normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                                 *)&block_1), bVar1) {
        ppBVar2 = __gnu_cxx::
                  __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
                  ::operator*(&__end0_1);
        local_d8 = *ppBVar2;
        sVar3 = std::
                unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                ::count((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                         *)&mark_visited,&local_d8);
        if (sVar3 == 0) {
          std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
          push_back(__return_storage_ptr__,&local_d8);
          TraversalRoots::anon_class_32_4_fc377077::operator()
                    ((anon_class_32_4_fc377077 *)local_90,local_d8);
        }
        __gnu_cxx::
        __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
        ::operator++(&__end0_1);
      }
      std::
      unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      ::~unordered_set((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                        *)&mark_visited);
      return __return_storage_ptr__;
    }
    ppBVar2 = __gnu_cxx::
              __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
              ::operator*(&__end0);
    __range2_1 = (vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  *)*ppBVar2;
    this = std::
           function<const_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_*(const_spvtools::val::BasicBlock_*)>
           ::operator()(pred_func,(BasicBlock *)__range2_1);
    bVar1 = std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
            empty(this);
    if (bVar1) {
      sVar3 = std::
              unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
              ::count((unordered_set<const_spvtools::val::BasicBlock_*,_std::hash<const_spvtools::val::BasicBlock_*>,_std::equal_to<const_spvtools::val::BasicBlock_*>,_std::allocator<const_spvtools::val::BasicBlock_*>_>
                       *)&mark_visited,(key_type *)&__range2_1);
      if (sVar3 != 0) {
        __assert_fail("visited.count(block) == 0 && \"Malformed graph!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/cfa.h"
                      ,0x14a,
                      "static std::vector<BB *> spvtools::CFA<spvtools::val::BasicBlock>::TraversalRoots(const std::vector<BB *> &, get_blocks_func, get_blocks_func) [BB = spvtools::val::BasicBlock]"
                     );
      }
      std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      push_back(__return_storage_ptr__,(value_type *)&__range2_1);
      TraversalRoots::anon_class_32_4_fc377077::operator()
                ((anon_class_32_4_fc377077 *)local_90,(BasicBlock *)__range2_1);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::val::BasicBlock_*const_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

std::vector<BB*> CFA<BB>::TraversalRoots(const std::vector<BB*>& blocks,
                                         get_blocks_func succ_func,
                                         get_blocks_func pred_func) {
  // The set of nodes which have been visited from any of the roots so far.
  std::unordered_set<const BB*> visited;

  auto mark_visited = [&visited](const BB* b) { visited.insert(b); };
  auto ignore_block = [](const BB*) {};
  auto no_terminal_blocks = [](const BB*) { return false; };

  auto traverse_from_root = [&mark_visited, &succ_func, &ignore_block,
                             &no_terminal_blocks](const BB* entry) {
    DepthFirstTraversal(entry, succ_func, mark_visited, ignore_block,
                        no_terminal_blocks);
  };

  std::vector<BB*> result;

  // First collect nodes without predecessors.
  for (auto block : blocks) {
    if (pred_func(block)->empty()) {
      assert(visited.count(block) == 0 && "Malformed graph!");
      result.push_back(block);
      traverse_from_root(block);
    }
  }

  // Now collect other stranded nodes.  These must be in unreachable cycles.
  for (auto block : blocks) {
    if (visited.count(block) == 0) {
      result.push_back(block);
      traverse_from_root(block);
    }
  }

  return result;
}